

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O0

float deqp::gles3::Functional::getEpsFromMaxUlpDiff(float value,deUint32 ulpDiff)

{
  float fVar1;
  float fVar2;
  Float<unsigned_int,_8,_23,_127,_3U> local_20;
  Float<unsigned_int,_8,_23,_127,_3U> local_1c;
  Float<unsigned_int,_8,_23,_127,_3U> local_18;
  int local_14;
  deUint32 local_10;
  int exp;
  deUint32 ulpDiff_local;
  float value_local;
  
  local_10 = ulpDiff;
  exp = (int)value;
  tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_18,value);
  local_14 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_18);
  local_1c = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct(1,local_14,local_10 | 0x800000);
  fVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_1c);
  local_20 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct(1,local_14,0x800000);
  fVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_20);
  return fVar1 - fVar2;
}

Assistant:

inline float getEpsFromMaxUlpDiff (float value, deUint32 ulpDiff)
{
	const int exp = tcu::Float32(value).exponent();
	return tcu::Float32::construct(+1, exp, (1u<<23) | ulpDiff).asFloat() - tcu::Float32::construct(+1, exp, 1u<<23).asFloat();
}